

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

string * __thiscall
cmState::Snapshot::GetExecutionListFile_abi_cxx11_(string *__return_storage_ptr__,Snapshot *this)

{
  PointerType pSVar1;
  ReferenceType pbVar2;
  Snapshot *this_local;
  
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pbVar2 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::iterator::operator*(&pSVar1->ExecutionListFile);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string cmState::Snapshot::GetExecutionListFile() const
{
  return *this->Position->ExecutionListFile;
}